

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transfer_Control_Request_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Transfer_Control_Request_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Transfer_Control_Request_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pRVar3;
  KINT32 Value;
  KINT32 Value_00;
  KString local_2a0;
  KString local_280;
  __normal_iterator<const_KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
  local_260;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Transfer_Control_Request_PDU *local_18;
  Transfer_Control_Request_PDU *this_local;
  
  local_18 = this;
  this_local = (Transfer_Control_Request_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Transfer Control Request PDU-\n");
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_1f0,&this->super_Simulation_Management_Header);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"Request ID:                   ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui32ReqID);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Required Reliability Service: ");
  DATA_TYPE::ENUMS::GetEnumAsStringRequiredReliabilityService_abi_cxx11_
            (&local_210,(ENUMS *)(ulong)this->m_ui8ReqRelSrv,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_210);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Transfer Type:                ");
  DATA_TYPE::ENUMS::GetEnumAsStringTransferType_abi_cxx11_
            (&local_230,(ENUMS *)(ulong)this->m_ui8TrnTyp,Value_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  poVar2 = std::operator<<(poVar2,"\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_((KString *)&citr,&this->m_TrnsEntID);
  poVar2 = std::operator<<(poVar2,(string *)&citr);
  poVar2 = std::operator<<(poVar2,"Number Of record Sets:        ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui32NumRecSets);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::
            begin(&this->m_vRecs);
  local_260._M_current =
       (RecordSet *)
       std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::end
                 (&this->m_vRecs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_260);
    if (!bVar1) break;
    pRVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
             ::operator->(&citrEnd);
    (*(pRVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_2a0);
    UTILS::IndentString(&local_280,&local_2a0,1,'\t');
    std::operator<<(local_190,(string *)&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Transfer_Control_Request_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Transfer Control Request PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "Request ID:                   " << m_ui32ReqID << "\n"
       << "Required Reliability Service: " << GetEnumAsStringRequiredReliabilityService( m_ui8ReqRelSrv ) << "\n"
       << "Transfer Type:                " << GetEnumAsStringTransferType( m_ui8TrnTyp ) << "\n"
       << m_TrnsEntID.GetAsString()
       << "Number Of record Sets:        " << m_ui32NumRecSets << "\n";

    vector<RecordSet>::const_iterator citr = m_vRecs.begin();
    vector<RecordSet>::const_iterator citrEnd = m_vRecs.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << IndentString( citr->GetAsString(), 1 );
    }

    return ss.str();
}